

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

ConnectionState __thiscall helics::CoreBroker::getAllConnectionState(CoreBroker *this)

{
  bool bVar1;
  long in_RDI;
  BasicBrokerInfo *brk;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range1;
  int cnt;
  ConnectionState res;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_20;
  long local_18;
  int local_10;
  ConnectionState local_9;
  
  local_9 = DISCONNECTED;
  local_10 = 0;
  local_18 = in_RDI + 0x360;
  local_20._M_current =
       (BasicBrokerInfo *)
       gmlc::containers::
       DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
       ::begin((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  ::end((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
         *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                           ((__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
         ::operator*(&local_20);
    if (((in_stack_ffffffffffffffd0->_nonLocal & 1U) == 0) &&
       (local_10 = local_10 + 1, in_stack_ffffffffffffffd0->state < local_9)) {
      local_9 = in_stack_ffffffffffffffd0->state;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
    ::operator++(&local_20);
  }
  if (local_10 < 1) {
    local_9 = CONNECTED;
  }
  return local_9;
}

Assistant:

ConnectionState CoreBroker::getAllConnectionState() const
{
    ConnectionState res = ConnectionState::DISCONNECTED;
    int cnt{0};
    for (const auto& brk : mBrokers) {
        if (brk._nonLocal) {
            continue;
        }
        ++cnt;
        if (brk.state < res) {
            res = brk.state;
        }
    }
    return (cnt > 0) ? res : ConnectionState::CONNECTED;
}